

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

bool __thiscall implementations::scheme::SchemeFrame::dispatchCall(SchemeFrame *this)

{
  const_iterator it;
  bool bVar1;
  _instruction_type _Var2;
  
  it._M_current =
       (this->resolved_arguments).
       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2 = SchemeInstructionConverter::convert(&this->exp);
  switch(_Var2) {
  case If:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)1>::dispatch
                      (this,it);
    return bVar1;
  case Set:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)2>::dispatch
                      (this,it);
    return bVar1;
  case Define:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)3>::dispatch
                      (this,it);
    return bVar1;
  default:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)7>::dispatch
                      (this,it);
    return bVar1;
  case Begin:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)5>::dispatch
                      (this,it);
    return bVar1;
  case Proc:
    bVar1 = SchemeDispatcher<(implementations::scheme::instruction::instruction)6>::dispatch
                      (this,it);
    return bVar1;
  }
}

Assistant:

bool SchemeFrame::dispatchCall() {
	// all of our arguments are now resolved, dispatch
	cells::const_iterator it = resolved_arguments.cbegin();
	instruction::instruction ins = SchemeInstructionConverter::convert(exp);
	switch (ins) {
	case instruction::If:
		return SchemeDispatcher<instruction::If>::dispatch(*this, it);
	case instruction::Begin:
		return SchemeDispatcher<instruction::Begin>::dispatch(*this, it);
	case instruction::Set:
		return SchemeDispatcher<instruction::Set>::dispatch(*this, it);
	case instruction::Define:
		return SchemeDispatcher<instruction::Define>::dispatch(*this, it);
	case instruction::Proc:
		return SchemeDispatcher<instruction::Proc>::dispatch(*this, it);
	default:
		return SchemeDispatcher<instruction::Invalid>::dispatch(*this, it);
	}
}